

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

uint64_t kratos::Simulator::static_evaluate_expr(Var *expr)

{
  bool *this;
  value_type vVar1;
  bool bVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  size_type sVar4;
  UserException *pUVar5;
  reference pvVar6;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  char (*format_str) [37];
  char (*format_str_00) [37];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view format_str_01;
  string_view format_str_02;
  v7 local_368 [32];
  string local_348;
  value_type local_328;
  int64_t value;
  v7 local_318 [32];
  string local_2f8;
  undefined1 local_2c8 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> result;
  Simulator sim;
  Var *expr_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_f0;
  basic_string_view<char> local_e8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_b8;
  string *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_68;
  string *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  this = &result.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_engaged;
  Simulator((Simulator *)this,(Generator *)0x0);
  eval_expr((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_2c8,
            (Simulator *)this,expr);
  bVar2 = std::optional::operator_cast_to_bool((optional *)local_2c8);
  if (bVar2) {
    pvVar3 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator*
                       ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                        local_2c8);
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar3);
    if (sVar4 == 1) {
      pvVar3 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator*
                         ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                          local_2c8);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar3,0);
      vVar1 = *pvVar6;
      local_328 = vVar1;
      if (0 < (long)vVar1) {
        std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
                  ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                   local_2c8);
        ~Simulator((Simulator *)
                   &result.
                    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ._M_engaged);
        return vVar1;
      }
      pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
      (*(expr->super_IRNode)._vptr_IRNode[0x1f])(local_368);
      local_b0 = &local_348;
      local_b8 = "Unable to static elaborate value {0}";
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_368;
      local_d8.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string,char[37],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"Unable to static elaborate value {0}",(v7 *)vargs_1,format_str_00,in_RCX);
      local_c8 = &local_d8;
      local_e8 = fmt::v7::to_string_view<char,_0>(local_b8);
      local_40 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&expr_local;
      local_48 = local_c8;
      local_38 = local_c8;
      local_10 = local_c8;
      local_30 = local_40;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_40,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_c8->string);
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_f0.values_;
      format_str_02.size_ = (size_t)expr_local;
      format_str_02.data_ = (char *)local_e8.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_348,(detail *)local_e8.data_,format_str_02,args_00)
      ;
      UserException::UserException(pUVar5,&local_348);
      __cxa_throw(pUVar5,&UserException::typeinfo,UserException::~UserException);
    }
  }
  value._7_1_ = 1;
  pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
  (*(expr->super_IRNode)._vptr_IRNode[0x1f])(local_318);
  local_60 = &local_2f8;
  local_68 = "Unable to static elaborate value {0}";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_318;
  local_88.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string,char[37],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"Unable to static elaborate value {0}",(v7 *)vargs,format_str,in_RCX);
  local_78 = &local_88;
  local_98 = fmt::v7::to_string_view<char,_0>(local_68);
  local_50 = &local_a8;
  local_58 = local_78;
  local_28 = local_78;
  local_18 = local_78;
  local_20 = local_50;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_50,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_78->string);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_a8.field_1.values_;
  format_str_01.size_ = local_a8.desc_;
  format_str_01.data_ = (char *)local_98.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_2f8,(detail *)local_98.data_,format_str_01,args);
  UserException::UserException(pUVar5,&local_2f8);
  value._7_1_ = 0;
  __cxa_throw(pUVar5,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

uint64_t Simulator::static_evaluate_expr(Var *expr) {
    // static evaluate the expression using built-in simulator
    Simulator sim(nullptr);
    auto result = sim.eval_expr(expr);
    // sanity check, no coverage
    // LCOV_EXCL_START
    if (!result || (*result).size() != 1)
        throw UserException(::format("Unable to static elaborate value {0}", expr->to_string()));
    auto value = static_cast<int64_t>((*result)[0]);
    if (value <= 0)
        throw UserException(::format("Unable to static elaborate value {0}", expr->to_string()));
    return static_cast<uint64_t>(value);
}